

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O3

void __thiscall QPDFMatrix::QPDFMatrix(QPDFMatrix *this,Matrix *m)

{
  double dVar1;
  
  dVar1 = m->b;
  this->a = m->a;
  this->b = dVar1;
  dVar1 = m->d;
  this->c = m->c;
  this->d = dVar1;
  dVar1 = m->f;
  this->e = m->e;
  this->f = dVar1;
  return;
}

Assistant:

QPDFMatrix::QPDFMatrix(QPDFObjectHandle::Matrix const& m) :
    a(m.a),
    b(m.b),
    c(m.c),
    d(m.d),
    e(m.e),
    f(m.f)
{
}